

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O0

void tommy_trie_inplace_insert
               (tommy_trie_inplace *trie_inplace,tommy_trie_inplace_node *node,void *data,
               tommy_key_t key)

{
  long lVar1;
  long in_FS_OFFSET;
  uint local_3c;
  tommy_uint_t i;
  tommy_trie_inplace_node **let_ptr;
  tommy_key_t key_local;
  void *data_local;
  tommy_trie_inplace_node *node_local;
  tommy_trie_inplace *trie_inplace_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  node->data = data;
  node->key = key;
  for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
    node->map[local_3c] = (tommy_trie_inplace_node_struct *)0x0;
  }
  trie_inplace_bucket_insert(0x1a,trie_inplace->bucket + (key >> 0x1a),node,key);
  trie_inplace->count = trie_inplace->count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_trie_inplace_insert(tommy_trie_inplace* trie_inplace, tommy_trie_inplace_node* node, void* data, tommy_key_t key)
{
	tommy_trie_inplace_node** let_ptr;
	tommy_uint_t i;

	node->data = data;
	node->key = key;
	/* clear the child pointers */
	for (i = 0; i < TOMMY_TRIE_INPLACE_TREE_MAX; ++i)
		node->map[i] = 0;

	let_ptr = &trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];

	trie_inplace_bucket_insert(TOMMY_TRIE_INPLACE_BUCKET_SHIFT, let_ptr, node, key);

	++trie_inplace->count;
}